

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view_test.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::StringViewFieldTest_RepeatedSetByCharPtr_Test::
~StringViewFieldTest_RepeatedSetByCharPtr_Test(StringViewFieldTest_RepeatedSetByCharPtr_Test *this)

{
  StringViewFieldTest_RepeatedSetByCharPtr_Test *this_local;
  
  ~StringViewFieldTest_RepeatedSetByCharPtr_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(StringViewFieldTest, RepeatedSetByCharPtr) {
  TestStringView message;

  const char* ptr0 = "foo";
  const char* ptr1 = "baz";
  const char* ptr2 = STRING_PAYLOAD;
  message.add_repeated_string(ptr0);
  message.add_repeated_string(ptr1);
  message.add_repeated_string(ptr2);

  EXPECT_THAT(message.repeated_string(),
              ElementsAre("foo", "baz", STRING_PAYLOAD));

  message.set_repeated_string(0, ptr1);
  message.set_repeated_string(1, ptr2);
  message.set_repeated_string(2, ptr0);

  EXPECT_THAT(message.repeated_string(),
              ElementsAre("baz", STRING_PAYLOAD, "foo"));
}